

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::satisfied(Solver *this,Clause *c)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Clause *in_RSI;
  Solver *in_RDI;
  int i;
  bool local_49;
  Lit in_stack_ffffffffffffffc0;
  lbool local_39;
  int local_38;
  lbool local_31;
  int local_30;
  lbool local_29;
  int local_28;
  lbool local_22;
  lbool local_21;
  int local_20;
  lbool local_19;
  Clause *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  iVar2 = vec<Minisat::Lit>::size(&in_RDI->assumptions);
  if (iVar2 == 0) {
    for (local_30 = 0; iVar2 = local_30, iVar3 = Clause::size(local_18), iVar2 < iVar3;
        local_30 = local_30 + 1) {
      local_38 = (int)Clause::operator[](local_18,local_30);
      local_31 = value(in_RDI,in_stack_ffffffffffffffc0);
      lbool::lbool(&local_39,'\0');
      bVar1 = lbool::operator==(&local_31,local_39);
      if (bVar1) {
        return true;
      }
    }
    local_1 = false;
  }
  else {
    local_20 = (int)Clause::operator[](local_18,0);
    local_19 = value(in_RDI,in_stack_ffffffffffffffc0);
    lbool::lbool(&local_21,'\0');
    bVar1 = lbool::operator==(&local_19,local_21);
    local_49 = true;
    if (!bVar1) {
      local_28 = (int)Clause::operator[](local_18,1);
      local_22 = value(in_RDI,in_stack_ffffffffffffffc0);
      lbool::lbool(&local_29,'\0');
      local_49 = lbool::operator==(&local_22,local_29);
    }
    local_1 = local_49;
  }
  return local_1;
}

Assistant:

bool Solver::satisfied(const Clause &c) const
{
    if (assumptions.size()) // Check clauses with many selectors is too time consuming
        return (value(c[0]) == l_True) || (value(c[1]) == l_True);

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True) return true;
    return false;
}